

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::mod(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  Integer *this;
  reference ppDVar4;
  reference ppDVar5;
  long local_80;
  long local_68;
  Data *i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  long local_20;
  Integer *local_18;
  Data *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  local_18 = (Integer *)0x0;
  result = (Data *)dataPara;
  this = (Integer *)operator_new(0x18);
  ppDVar4 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[]
                      ((vector<Data_*,_std::allocator<Data_*>_> *)result,0);
  if (*ppDVar4 == (value_type)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = __dynamic_cast(*ppDVar4,&typeinfo,&Integer::typeinfo,0);
  }
  lVar1 = *(long *)(local_68 + 0x10);
  ppDVar4 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[]
                      ((vector<Data_*,_std::allocator<Data_*>_> *)result,1);
  if (*ppDVar4 == (value_type)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = __dynamic_cast(*ppDVar4,&typeinfo,&Integer::typeinfo,0);
  }
  local_20 = lVar1 % *(long *)(local_80 + 0x10);
  Integer::Integer(this,&local_20);
  pDVar2 = result;
  local_18 = this;
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin
                     ((vector<Data_*,_std::allocator<Data_*>_> *)result);
  i = (Data *)std::vector<Data_*,_std::allocator<Data_*>_>::end
                        ((vector<Data_*,_std::allocator<Data_*>_> *)pDVar2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                *)&i);
    pDVar2 = result;
    if (!bVar3) break;
    ppDVar5 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    check(*ppDVar5);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (result != (Data *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector
              ((vector<Data_*,_std::allocator<Data_*>_> *)result);
    operator_delete(pDVar2);
  }
  return &local_18->super_Data;
}

Assistant:

Data *Data::mod(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    result = new Integer(
            (dynamic_cast<Integer *>((*dataPara)[0]))->value
            % (dynamic_cast<Integer *>((*dataPara)[1]))->value
    );
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}